

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O1

_Bool rcnb_decode_short(wchar_t *value_in,char **value_out)

{
  wchar_t wVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  wVar1 = *value_in;
  bVar3 = 1;
  lVar6 = 0;
  do {
    if (*(wchar_t *)((long)L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ" + lVar6) == wVar1) {
      bVar3 = (byte)(uint)((ulong)lVar6 >> 0x21) & 1;
      break;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x3c);
  uVar5 = 0xffffffff;
  if (bVar3 == 0) {
    lVar9 = 0x3c;
    lVar6 = 0;
    do {
      if (L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[lVar6] == wVar1) goto LAB_001015d5;
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + -4;
    } while (lVar9 != 0);
    lVar6 = 0xffffffff;
LAB_001015d5:
    uVar7 = (uint)lVar6;
    lVar6 = 0x3c;
    lVar9 = 0;
    do {
      if (L"cCĆćĈĉĊċČčƇƈÇȻȼ"[lVar9] == value_in[1]) {
        uVar5 = (uint)lVar9;
        break;
      }
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
    uVar8 = 0xffffffff;
    lVar6 = 0x3c;
    lVar9 = 0;
    do {
      if (L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[lVar9] == value_in[2]) goto LAB_001016d2;
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
    lVar9 = 0xffffffff;
LAB_001016d2:
    uVar10 = (uint)lVar9;
    lVar6 = 0x28;
    lVar9 = 0;
    do {
      if (L"bBƀƁƃƄƅßÞþ"[lVar9] == value_in[3]) goto LAB_00101704;
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
  }
  else {
    lVar9 = 0x3c;
    lVar6 = 0;
    do {
      if (L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[lVar6] == value_in[2]) goto LAB_00101578;
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + -4;
    } while (lVar9 != 0);
    lVar6 = 0xffffffff;
LAB_00101578:
    uVar7 = (uint)lVar6;
    lVar6 = 0x3c;
    lVar9 = 0;
    do {
      if (L"cCĆćĈĉĊċČčƇƈÇȻȼ"[lVar9] == value_in[3]) {
        uVar5 = (uint)lVar9;
        break;
      }
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
    uVar8 = 0xffffffff;
    lVar9 = 0x3c;
    lVar6 = 0;
    do {
      if (L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[lVar6] == wVar1) goto LAB_00101652;
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + -4;
    } while (lVar9 != 0);
    lVar6 = 0xffffffff;
LAB_00101652:
    uVar10 = (uint)lVar6;
    lVar6 = 0x28;
    lVar9 = 0;
    do {
      if (L"bBƀƁƃƄƅßÞþ"[lVar9] == value_in[1]) goto LAB_00101704;
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
  }
LAB_00101707:
  if ((int)(uVar7 | uVar5 | uVar10 | uVar8) < 0) {
    bVar4 = false;
  }
  else {
    uVar8 = ((uVar7 * 0xf + uVar5) * 0xf + uVar10) * 10 + uVar8;
    bVar4 = (int)uVar8 < 0x8000;
    if ((int)uVar8 < 0x8000) {
      uVar5 = uVar8 | 0x8000;
      if (bVar3 == 0) {
        uVar5 = uVar8;
      }
      pcVar2 = *value_out;
      *value_out = pcVar2 + 1;
      *pcVar2 = (char)(uVar5 >> 8);
      pcVar2 = *value_out;
      *value_out = pcVar2 + 1;
      *pcVar2 = (char)uVar5;
      bVar4 = true;
    }
  }
  return bVar4;
LAB_00101704:
  uVar8 = (uint)lVar9;
  goto LAB_00101707;
}

Assistant:

bool rcnb_decode_short(const wchar_t* value_in, char** value_out)
{
    bool reverse = find(cr, sr, *value_in) < 0;
    int idx[4];
    if (!reverse) {
        idx[0] = find(cr, sr, *value_in);
        idx[1] = find(cc, sc, *(value_in + 1));
        idx[2] = find(cn, sn, *(value_in + 2));
        idx[3] = find(cb, sb, *(value_in + 3));
    } else {
        idx[0] = find(cr, sr, *(value_in + 2));
        idx[1] = find(cc, sc, *(value_in + 3));
        idx[2] = find(cn, sn, *value_in);
        idx[3] = find(cb, sb, *(value_in + 1));
    }
    if (idx[0] < 0 || idx[1] < 0 || idx[2] < 0 || idx[3] < 0)
        return false;
    int result = idx[0] * scnb + idx[1] * snb + idx[2] * sb + idx[3];
    if (result > 0x7FFF)
        return false;
    result = reverse ? result | 0x8000 : result;
    *(*value_out)++ = (char)(result >> 8);
    *(*value_out)++ = (char)(result & 0xFF);
    return true;
}